

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_makers.hpp
# Opt level: O0

bool so_5::details::handlers_bunch_basics_t::find_and_use_handler
               (msg_type_and_handler_pair_t *left,msg_type_and_handler_pair_t *right,
               type_index *msg_type,message_ref_t *message,invocation_type_t invocation)

{
  anon_class_24_3_ebd80789 handler;
  undefined1 uVar1;
  bool bVar2;
  undefined4 uStack_84;
  msg_type_and_handler_pair_t *local_70;
  msg_type_and_handler_pair_t *it;
  undefined1 local_60 [8];
  msg_type_and_handler_pair_t key;
  bool ret_value;
  invocation_type_t invocation_local;
  message_ref_t *message_local;
  type_index *msg_type_local;
  msg_type_and_handler_pair_t *right_local;
  msg_type_and_handler_pair_t *left_local;
  
  key.m_mutability._3_1_ = immutable_message >> 0x18;
  it = (msg_type_and_handler_pair_t *)msg_type->_M_target;
  key._44_4_ = invocation;
  msg_type_and_handler_pair_t::msg_type_and_handler_pair_t
            ((msg_type_and_handler_pair_t *)local_60,(type_index)it);
  local_70 = std::
             lower_bound<so_5::details::msg_type_and_handler_pair_t_const*,so_5::details::msg_type_and_handler_pair_t>
                       (left,right,(msg_type_and_handler_pair_t *)local_60);
  if ((local_70 != right) &&
     (bVar2 = std::type_index::operator==(&local_70->m_msg_type,(type_index *)local_60), bVar2)) {
    key.m_mutability._3_1_ = 1;
    if (key._44_4_ == 0) {
      std::function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)>::
      operator()(&local_70->m_handler,event,message);
    }
    else if (key._44_4_ == 1) {
      handler._20_4_ = uStack_84;
      handler.invocation = 1;
      handler.message = message;
      handler.it = &local_70;
      msg_service_request_base_t::
      dispatch_wrapper<so_5::details::handlers_bunch_basics_t::find_and_use_handler(so_5::details::msg_type_and_handler_pair_t_const*,so_5::details::msg_type_and_handler_pair_t_const*,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>&,so_5::invocation_type_t)::_lambda()_1_>
                (message,handler);
    }
  }
  uVar1 = key.m_mutability._3_1_;
  msg_type_and_handler_pair_t::~msg_type_and_handler_pair_t((msg_type_and_handler_pair_t *)local_60)
  ;
  return (bool)(uVar1 & 1);
}

Assistant:

static inline bool
		find_and_use_handler(
			const msg_type_and_handler_pair_t * left,
			const msg_type_and_handler_pair_t * right,
			const std::type_index & msg_type,
			message_ref_t & message,
			invocation_type_t invocation )
			{
				bool ret_value = false;

				msg_type_and_handler_pair_t key{ msg_type };
				auto it = std::lower_bound( left, right, key );
				if( it != right && it->m_msg_type == key.m_msg_type )
					{
						// Handler is found and must be called.
						ret_value = true;
						if( invocation_type_t::event == invocation )
							// This is a async message.
							// Simple call is enough.
							it->m_handler( invocation, message );
						else if( invocation_type_t::service_request == invocation )
							// Invocation should be done in a special wrapper.
							msg_service_request_base_t::dispatch_wrapper(
									message,
									[&it, &message, invocation] {
										it->m_handler( invocation, message );
									} );
					}

				return ret_value;
			}